

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gabby.cc
# Opt level: O2

void __thiscall GB::call_cc_nn(GB *this,u8 mask,u8 val)

{
  u8 uVar1;
  ulong uVar2;
  
  uVar2 = (this->s).op_tick - 0xe;
  switch(uVar2 << 0x3d | uVar2 >> 3) {
  case 0:
    uVar1 = read_n(this);
    (this->s).field_6.field_0.z = uVar1;
    return;
  case 1:
    uVar1 = read_n(this);
    (this->s).field_6.field_0.w = uVar1;
    if ((mask & (this->s).field_2.field_0.f) == val) {
      return;
    }
    break;
  default:
    goto switchD_00107f71_caseD_2;
  case 3:
    push(this,*(u8 *)((long)&(this->s).pc + 1));
    return;
  case 4:
    push(this,(u8)(this->s).pc);
    (this->s).pc = (u16)(this->s).field_6;
  }
  (this->s).op_tick = -2;
switchD_00107f71_caseD_2:
  return;
}

Assistant:

void GB::call_cc_nn(u8 mask, u8 val) {
  switch (s.op_tick) {
    case 14: s.z = read_n(); break;
    case 22: s.w = read_n(); f_is(mask, val); break;
    case 38: push(s.pc >> 8); break;
    case 46: push(s.pc); s.pc = s.wz; op_done(); break;
  }
}